

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O3

int run_test_metrics_idle_time_thread(void)

{
  int *piVar1;
  int iVar2;
  uv_loop_t *puVar3;
  void *pvVar4;
  code *loop;
  long lVar5;
  int64_t eval_b;
  int64_t eval_a;
  uv_thread_t threads [5];
  undefined1 auStack_500 [168];
  code *pcStack_458;
  uv_loop_t *puStack_450;
  uv_loop_t *puStack_448;
  int iStack_43c;
  uv_timer_t uStack_438;
  uv_loop_t uStack_3a0;
  code *pcStack_50;
  long local_48;
  long local_40;
  uv_thread_t auStack_38 [5];
  
  lVar5 = 0;
  loop = metrics_routine_cb;
  while( true ) {
    local_40 = 0;
    pcStack_50 = (code *)0x16c4fc;
    iVar2 = uv_thread_create((uv_thread_t *)((long)auStack_38 + lVar5),metrics_routine_cb,
                             (void *)0x0);
    local_48 = (long)iVar2;
    if (local_40 != local_48) break;
    lVar5 = lVar5 + 8;
    if (lVar5 == 0x28) {
      lVar5 = 0;
      do {
        pcStack_50 = (code *)0x16c526;
        uv_thread_join((uv_thread_t *)((long)auStack_38 + lVar5));
        lVar5 = lVar5 + 8;
      } while (lVar5 != 0x28);
      return 0;
    }
  }
  pcStack_50 = metrics_routine_cb;
  run_test_metrics_idle_time_thread_cold_1();
  pcStack_50 = metrics_routine_cb;
  uStack_438.data = &iStack_43c;
  iStack_43c = 0;
  puStack_448 = (uv_loop_t *)0x0;
  pcStack_458 = (code *)0x16c575;
  iVar2 = uv_loop_init(&uStack_3a0);
  puStack_450 = (uv_loop_t *)(long)iVar2;
  if (puStack_448 == puStack_450) {
    puStack_448 = (uv_loop_t *)0x0;
    pcStack_458 = (code *)0x16c5a7;
    iVar2 = uv_loop_configure(&uStack_3a0,UV_METRICS_IDLE_TIME);
    puStack_450 = (uv_loop_t *)(long)iVar2;
    if (puStack_448 != puStack_450) goto LAB_0016c6f4;
    puStack_448 = (uv_loop_t *)0x0;
    pcStack_458 = (code *)0x16c5d7;
    iVar2 = uv_timer_init(&uStack_3a0,&uStack_438);
    puStack_450 = (uv_loop_t *)(long)iVar2;
    if (puStack_448 != puStack_450) goto LAB_0016c701;
    puStack_448 = (uv_loop_t *)0x0;
    pcStack_458 = (code *)0x16c60d;
    iVar2 = uv_timer_start(&uStack_438,timer_spin_cb,1000,0);
    puStack_450 = (uv_loop_t *)(long)iVar2;
    if (puStack_448 != puStack_450) goto LAB_0016c70e;
    puStack_448 = (uv_loop_t *)0x0;
    pcStack_458 = (code *)0x16c63a;
    iVar2 = uv_run(&uStack_3a0,UV_RUN_DEFAULT);
    puStack_450 = (uv_loop_t *)(long)iVar2;
    if (puStack_448 != puStack_450) goto LAB_0016c71b;
    puStack_448 = (uv_loop_t *)(long)iStack_43c;
    puStack_450 = (uv_loop_t *)0x0;
    if ((long)puStack_448 < 1) goto LAB_0016c728;
    pcStack_458 = (code *)0x16c67d;
    puStack_448 = (uv_loop_t *)uv_metrics_idle_time(&uStack_3a0);
    puStack_450 = (uv_loop_t *)0x1dcd6500;
    if ((long)puStack_448 < 500000000) goto LAB_0016c735;
    loop = (code *)&uStack_3a0;
    pcStack_458 = (code *)0x16c6b2;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    pcStack_458 = (code *)0x16c6bc;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puStack_448 = (uv_loop_t *)0x0;
    pcStack_458 = (code *)0x16c6cd;
    iVar2 = uv_loop_close((uv_loop_t *)loop);
    puStack_450 = (uv_loop_t *)(long)iVar2;
    if (puStack_448 == puStack_450) {
      return (int)puStack_448;
    }
  }
  else {
    pcStack_458 = (code *)0x16c6f4;
    metrics_routine_cb_cold_1();
LAB_0016c6f4:
    pcStack_458 = (code *)0x16c701;
    metrics_routine_cb_cold_2();
LAB_0016c701:
    pcStack_458 = (code *)0x16c70e;
    metrics_routine_cb_cold_3();
LAB_0016c70e:
    pcStack_458 = (code *)0x16c71b;
    metrics_routine_cb_cold_4();
LAB_0016c71b:
    pcStack_458 = (code *)0x16c728;
    metrics_routine_cb_cold_5();
LAB_0016c728:
    pcStack_458 = (code *)0x16c735;
    metrics_routine_cb_cold_6();
LAB_0016c735:
    pcStack_458 = (code *)0x16c742;
    metrics_routine_cb_cold_8();
  }
  pcStack_458 = run_test_metrics_idle_time_zero;
  metrics_routine_cb_cold_7();
  auStack_500._16_8_ = auStack_500 + 0xc;
  auStack_500._12_4_ = 0;
  auStack_500._0_8_ = (void *)0x0;
  pcStack_458 = loop;
  puVar3 = uv_default_loop();
  iVar2 = uv_loop_configure(puVar3,UV_METRICS_IDLE_TIME);
  if ((void *)auStack_500._0_8_ == (void *)(long)iVar2) {
    auStack_500._0_8_ = (void *)0x0;
    puVar3 = uv_default_loop();
    iVar2 = uv_timer_init(puVar3,(uv_timer_t *)(auStack_500 + 0x10));
    if ((void *)auStack_500._0_8_ != (void *)(long)iVar2) goto LAB_0016c8c4;
    auStack_500._0_8_ = (void *)0x0;
    iVar2 = uv_timer_start((uv_timer_t *)(auStack_500 + 0x10),timer_noop_cb,0,0);
    if ((void *)auStack_500._0_8_ != (void *)(long)iVar2) goto LAB_0016c8d1;
    auStack_500._0_8_ = (void *)0x0;
    puVar3 = uv_default_loop();
    iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
    if ((void *)auStack_500._0_8_ != (void *)(long)iVar2) goto LAB_0016c8de;
    auStack_500._0_8_ = SEXT48((int)auStack_500._12_4_);
    if ((long)auStack_500._0_8_ < 1) goto LAB_0016c8eb;
    auStack_500._0_8_ = (void *)0x0;
    puVar3 = uv_default_loop();
    pvVar4 = (void *)uv_metrics_idle_time(puVar3);
    if ((void *)auStack_500._0_8_ == pvVar4) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      puVar3 = uv_default_loop();
      iVar2 = uv_loop_close(puVar3);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0016c905;
    }
  }
  else {
    run_test_metrics_idle_time_zero_cold_1();
LAB_0016c8c4:
    run_test_metrics_idle_time_zero_cold_2();
LAB_0016c8d1:
    run_test_metrics_idle_time_zero_cold_3();
LAB_0016c8de:
    run_test_metrics_idle_time_zero_cold_4();
LAB_0016c8eb:
    run_test_metrics_idle_time_zero_cold_5();
  }
  puVar3 = (uv_loop_t *)auStack_500;
  run_test_metrics_idle_time_zero_cold_6();
LAB_0016c905:
  run_test_metrics_idle_time_zero_cold_7();
  piVar1 = (int *)puVar3->data;
  *piVar1 = *piVar1 + 1;
  return (int)piVar1;
}

Assistant:

TEST_IMPL(metrics_idle_time_thread) {
  uv_thread_t threads[5];
  int i;

  for (i = 0; i < 5; i++) {
    ASSERT_EQ(0, uv_thread_create(&threads[i], metrics_routine_cb, NULL));
  }

  for (i = 0; i < 5; i++) {
    uv_thread_join(&threads[i]);
  }

  return 0;
}